

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O0

void __thiscall xray_re::xr_swibuf::xr_swibuf(xr_swibuf *this,xr_swibuf *that)

{
  size_t size;
  ogf4_slide_window *poVar1;
  xr_swibuf *that_local;
  xr_swibuf *this_local;
  
  xr_flexbuf::xr_flexbuf(&this->super_xr_flexbuf);
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_swibuf_0038c788;
  xr_flexbuf::set_owner(&this->super_xr_flexbuf,true);
  size = xr_flexbuf::size(&that->super_xr_flexbuf);
  xr_flexbuf::set_size(&this->super_xr_flexbuf,size);
  poVar1 = xr_flexbuf::duplicate<xray_re::ogf4_slide_window>
                     (&this->super_xr_flexbuf,that->m_slide_windows);
  this->m_slide_windows = poVar1;
  return;
}

Assistant:

xr_swibuf::xr_swibuf(const xr_swibuf& that)
{
	set_owner(true);
	set_size(that.size());
	m_slide_windows = duplicate(that.m_slide_windows);
}